

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O1

void __thiscall wasm::MultiMemoryLowering::addCombinedMemory(MultiMemoryLowering *this)

{
  size_t sVar1;
  char *pcVar2;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> local_18;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  
  sVar1 = (this->combinedMemory).super_IString.str._M_len;
  pcVar2 = (this->combinedMemory).super_IString.str._M_str;
  local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_>)operator_new(0x58);
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40) = 0;
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x48) = 0;
  *(size_t *)
   local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl = 0;
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8) = 0;
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x18) = 0;
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x20) = 0;
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x28) = 0;
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x30) = 0;
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) = 0;
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40) = 0x10000;
  *(undefined1 *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x48) = 0;
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x50) = 2;
  *(size_t *)
   local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl = sVar1;
  *(char **)((long)local_18._M_t.
                   super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8) = pcVar2;
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) = 0;
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40) = 0x10000;
  *(undefined1 *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x48) = 0;
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x50) = 2;
  *(bool *)((long)local_18._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x48) = this->isShared
  ;
  *(uintptr_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x50) = (this->pointerType).id
  ;
  sVar1 = (this->totalMaxPages).addr;
  *(address64_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) =
       (this->totalInitialPages).addr;
  *(size_t *)
   ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40) = sVar1;
  if (this->isImported == true) {
    pcVar2 = (this->base).super_IString.str._M_str;
    *(size_t *)
     ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
            .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x28) =
         (this->base).super_IString.str._M_len;
    *(char **)((long)local_18._M_t.
                     super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                     super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x30) = pcVar2;
    pcVar2 = (this->module).super_IString.str._M_str;
    *(size_t *)
     ((long)local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
            .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x18) =
         (this->module).super_IString.str._M_len;
    *(char **)((long)local_18._M_t.
                     super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                     super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x20) = pcVar2;
  }
  Module::addMemory(this->wasm,
                    (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_18);
  if ((_Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>)
      local_18._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl != (Memory *)0x0) {
    operator_delete((void *)local_18._M_t.
                            super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                            .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,0x58);
  }
  return;
}

Assistant:

void addCombinedMemory() {
    auto memory = Builder::makeMemory(combinedMemory);
    memory->shared = isShared;
    memory->indexType = pointerType;
    memory->initial = totalInitialPages;
    memory->max = totalMaxPages;
    if (isImported) {
      memory->base = base;
      memory->module = module;
    }
    wasm->addMemory(std::move(memory));
  }